

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O0

int check_flag(char *flag,int argc,char **argv)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  option long_options [2];
  char short_flag [3];
  int option;
  int index;
  char *local_78 [3];
  int local_60;
  undefined1 local_2b;
  undefined1 local_2a;
  char local_29;
  int local_28;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  char *local_10;
  
  local_24 = 0;
  local_2b = 0x2b;
  local_2a = 0x3a;
  local_29 = *in_RDI;
  _optind = 0;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_78,0,0x40);
  local_78[0] = local_10;
  local_60 = (int)*local_10;
  do {
    local_28 = getopt_long(local_14,local_20,&local_2b,local_78,&local_24);
    if (local_28 == *local_10) {
      return 1;
    }
  } while (local_28 != -1);
  return 0;
}

Assistant:

int check_flag(const char *flag, int argc, char *argv[]) {
	// For getopt long options
	int index = 0;
	// The char returned by getopt()
	int option;
	// Setting the first character to be a plus
	// prevents getopt() from reordering the vector,
	// setting the second character to be a colon
	// prevents getopt() from printing an error
	// message when it encounters invalid options
	char short_flag[3] = {'+', ':', flag[0]};

	// Reset getopt index
	optind = 0;

	// clang-format off
	struct option long_options [2] = {
		{flag, no_argument, NULL, flag[0]},
		{0,    0,           0,    0}
	};
	// clang-format on

	while (true) {
		option = getopt_long(argc, argv, short_flag, long_options, &index);

		if (option == flag[0]) {
			return true;
		} else if (option == -1) {
			break;
		}
	}

	return false;
}